

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::CreateDefaultGlobalGenerator(cmake *this)

{
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_20;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gen;
  cmake *this_local;
  
  gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
       (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)this;
  EvaluateDefaultGlobalGenerator((cmake *)&stack0xffffffffffffffe8);
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::unique_ptr
            (&local_20,
             (unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
             &stack0xffffffffffffffe8);
  SetGlobalGenerator(this,&local_20);
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
            (&local_20);
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
            ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
             &stack0xffffffffffffffe8);
  return;
}

Assistant:

void cmake::CreateDefaultGlobalGenerator()
{
  auto gen = this->EvaluateDefaultGlobalGenerator();
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(CMAKE_BOOT_MINGW)
  // This print could be unified for all platforms
  std::cout << "-- Building for: " << gen->GetName() << "\n";
#endif
  this->SetGlobalGenerator(std::move(gen));
}